

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilterFederate.cpp
# Opt level: O2

void __thiscall helics::FilterFederate::organizeFilterOperations(FilterFederate *this)

{
  _Base_ptr this_00;
  long lVar1;
  bool bVar2;
  byte bVar3;
  function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
  *this_01;
  bool bVar4;
  bool bVar5;
  BasicHandleInfo *pBVar6;
  _Rb_tree_node_base *p_Var7;
  bool bVar8;
  size_t ii;
  ulong uVar9;
  long lVar10;
  _Rb_tree_node_base *p_Var11;
  basic_string_view<char,_std::char_traits<char>_> __args_2;
  reference rVar12;
  string_view type2;
  basic_string_view<char,_std::char_traits<char>_> __args_1;
  string_view type1;
  allocator_type local_b9;
  function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
  *local_b8;
  _Rb_tree_node_base *local_b0;
  FilterFederate *local_a8;
  _Rb_tree_node_base *local_a0;
  string currentType;
  vector<bool,_std::allocator<bool>_> used;
  string endpointType;
  
  p_Var11 = &(this->filterCoord)._M_t._M_impl.super__Rb_tree_header._M_header;
  local_b8 = &this->mLogger;
  local_b0 = p_Var11;
  local_a8 = this;
  for (p_Var7 = (this->filterCoord)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      p_Var7 != p_Var11; p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7)) {
    this_00 = p_Var7[1]._M_parent;
    pBVar6 = HandleManager::getHandleInfo(this->mHandles,(InterfaceHandle)p_Var7[1]._M_color);
    if (pBVar6 != (BasicHandleInfo *)0x0) {
      std::__cxx11::string::string((string *)&endpointType,&pBVar6->type);
      if (*(_Base_ptr *)(this_00 + 1) != this_00[1]._M_parent) {
        if (this_00->_M_parent != *(_Base_ptr *)this_00) {
          this_00->_M_parent = *(_Base_ptr *)this_00;
        }
        std::vector<helics::FilterInfo_*,_std::allocator<helics::FilterInfo_*>_>::reserve
                  ((vector<helics::FilterInfo_*,_std::allocator<helics::FilterInfo_*>_> *)this_00,
                   (long)this_00[1]._M_parent - (long)*(_Base_ptr *)(this_00 + 1) >> 3);
        currentType._M_dataplus._M_p._0_1_ = 0;
        std::vector<bool,_std::allocator<bool>_>::vector
                  (&used,(long)this_00[1]._M_parent - (long)*(pointer *)(this_00 + 1) >> 3,
                   (bool *)&currentType,&local_b9);
        local_a0 = p_Var7;
        std::__cxx11::string::string
                  ((string *)&currentType,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &endpointType);
        bVar4 = true;
        bVar8 = true;
        bVar2 = true;
        while ((p_Var7 = local_a0, this = local_a8, p_Var11 = local_b0, this_01 = local_b8, bVar8 &&
               (bVar4))) {
          lVar10 = 0;
          bVar3 = 0;
          bVar8 = false;
          for (uVar9 = 0;
              uVar9 < (ulong)((long)this_00[1]._M_parent - (long)*(pointer *)(this_00 + 1) >> 3);
              uVar9 = uVar9 + 1) {
            rVar12 = std::vector<bool,_std::allocator<bool>_>::operator[](&used,uVar9);
            bVar4 = bVar8;
            if ((*rVar12._M_p & rVar12._M_mask) == 0) {
              lVar1 = *(long *)((long)*(pointer *)(this_00 + 1) + lVar10);
              if (bVar2) {
                bVar4 = true;
                if (*(char *)(lVar1 + 0x99) == '\x01') {
                  std::vector<helics::FilterInfo_*,_std::allocator<helics::FilterInfo_*>_>::
                  push_back((vector<helics::FilterInfo_*,_std::allocator<helics::FilterInfo_*>_> *)
                            this_00,(value_type *)((long)*(pointer *)(this_00 + 1) + lVar10));
                  rVar12 = std::vector<bool,_std::allocator<bool>_>::operator[](&used,uVar9);
                  *rVar12._M_p = *rVar12._M_p | rVar12._M_mask;
                  bVar3 = 1;
                  bVar4 = bVar8;
                }
              }
              else {
                type2._M_str._1_7_ = currentType._M_dataplus._M_p._1_7_;
                type2._M_str._0_1_ = currentType._M_dataplus._M_p._0_1_;
                type2._M_len = currentType._M_string_length;
                type1._M_str = *(char **)(lVar1 + 0x28);
                type1._M_len = *(size_t *)(lVar1 + 0x30);
                bVar5 = helics::core::matchingTypes(type1,type2);
                bVar4 = true;
                if (bVar5) {
                  rVar12 = std::vector<bool,_std::allocator<bool>_>::operator[](&used,uVar9);
                  *rVar12._M_p = *rVar12._M_p | rVar12._M_mask;
                  std::vector<helics::FilterInfo_*,_std::allocator<helics::FilterInfo_*>_>::
                  push_back((vector<helics::FilterInfo_*,_std::allocator<helics::FilterInfo_*>_> *)
                            this_00,(value_type *)((long)*(pointer *)(this_00 + 1) + lVar10));
                  bVar3 = 1;
                  CLI::std::__cxx11::
                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &currentType,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             (*(long *)((long)*(pointer *)(this_00 + 1) + lVar10) + 0x48));
                  bVar4 = bVar8;
                }
              }
            }
            bVar8 = bVar4;
            lVar10 = lVar10 + 8;
          }
          bVar5 = bVar2;
          if (bVar2) {
            bVar5 = false;
          }
          bVar4 = (bool)(bVar3 | bVar2);
          bVar2 = bVar5;
        }
        for (uVar9 = 0;
            uVar9 < (ulong)((long)this_00[1]._M_parent - (long)*(pointer *)(this_00 + 1) >> 3);
            uVar9 = uVar9 + 1) {
          rVar12 = std::vector<bool,_std::allocator<bool>_>::operator[](&used,uVar9);
          if ((*rVar12._M_p & rVar12._M_mask) == 0) {
            __args_2._M_str = "unable to match types on some filters";
            __args_2._M_len = 0x25;
            __args_1._M_str = ((*(pointer *)(this_00 + 1))[uVar9]->key)._M_dataplus._M_p;
            __args_1._M_len = ((*(pointer *)(this_00 + 1))[uVar9]->key)._M_string_length;
            std::
            function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
            ::operator()(this_01,3,__args_1,__args_2);
          }
        }
        std::__cxx11::string::~string((string *)&currentType);
        std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
                  (&used.super__Bvector_base<std::allocator<bool>_>);
      }
      std::__cxx11::string::~string((string *)&endpointType);
    }
  }
  return;
}

Assistant:

void FilterFederate::organizeFilterOperations()
{
    for (auto& fc : filterCoord) {
        auto* fedInfo = fc.second.get();
        const auto* handle = mHandles->getHandleInfo(fc.first);
        if (handle == nullptr) {
            continue;
        }
        std::string endpointType = handle->type;

        if (!fedInfo->allSourceFilters.empty()) {
            fedInfo->sourceFilters.clear();
            fedInfo->sourceFilters.reserve(fedInfo->allSourceFilters.size());
            // Now we have to do some intelligent ordering with types
            std::vector<bool> used(fedInfo->allSourceFilters.size(), false);
            bool someUnused = true;
            bool usedMore = true;
            bool firstPass = true;
            std::string currentType = endpointType;
            while (someUnused && usedMore) {
                someUnused = false;
                usedMore = false;
                for (size_t ii = 0; ii < fedInfo->allSourceFilters.size(); ++ii) {
                    if (used[ii]) {
                        continue;
                    }
                    if (firstPass) {
                        if (fedInfo->allSourceFilters[ii]->cloning) {
                            fedInfo->sourceFilters.push_back(fedInfo->allSourceFilters[ii]);
                            used[ii] = true;
                            usedMore = true;
                        } else {
                            someUnused = true;
                        }
                    } else {
                        // TODO(PT): this will need some work to finish sorting out but should work
                        // for initial tests
                        if (core::matchingTypes(fedInfo->allSourceFilters[ii]->inputType,
                                                currentType)) {
                            used[ii] = true;
                            usedMore = true;
                            fedInfo->sourceFilters.push_back(fedInfo->allSourceFilters[ii]);
                            currentType = fedInfo->allSourceFilters[ii]->outputType;
                        } else {
                            someUnused = true;
                        }
                    }
                }
                if (firstPass) {
                    firstPass = false;
                    usedMore = true;
                }
            }
            for (size_t ii = 0; ii < fedInfo->allSourceFilters.size(); ++ii) {
                if (used[ii]) {
                    continue;
                }
                mLogger(HELICS_LOG_LEVEL_WARNING,
                        fedInfo->allSourceFilters[ii]->key,
                        "unable to match types on some filters");
            }
        }
    }
}